

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsOct<unsigned_char>
          (IntDigits *this,uchar v)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    this->storage_[lVar3 + 0x2b] = v & 7 | 0x30;
    bVar1 = 7 < v;
    lVar2 = lVar3 + -1;
    v = v >> 3;
  } while (bVar1);
  this->start_ = this->storage_ + lVar3 + 0x2b;
  this->size_ = -(lVar3 + -1);
  return;
}

Assistant:

void PrintAsOct(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);
    do {
      *--p = static_cast<char>('0' + (static_cast<size_t>(v) & 7));
      v >>= 3;
    } while (v);
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }